

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Average::backward_impl
          (Average *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float *pfVar1;
  float *pfVar2;
  bool bVar3;
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  Index size;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ushort uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  int iVar22;
  int iVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM6 [16];
  ulong uVar8;
  
  uVar8 = (ulong)(dEdf->d).nd;
  iVar23 = 1;
  iVar22 = 1;
  if (uVar8 != 0) {
    auVar15 = vpbroadcastq_avx512f();
    auVar16 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar10 = 0;
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar19 = vmovdqa64_avx512f(auVar16);
      auVar16 = vpbroadcastq_avx512f();
      auVar20 = vporq_avx512f(auVar16,auVar17);
      auVar16 = vporq_avx512f(auVar16,auVar18);
      uVar4 = vpcmpuq_avx512f(auVar16,auVar15,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar20,auVar15,2);
      bVar6 = (byte)uVar4;
      uVar13 = CONCAT11(bVar6,bVar5);
      auVar16 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar10));
      auVar20._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar16._4_4_;
      auVar20._0_4_ = (uint)(bVar5 & 1) * auVar16._0_4_;
      auVar20._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar16._8_4_;
      auVar20._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar16._12_4_;
      auVar20._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar16._16_4_;
      auVar20._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar16._20_4_;
      auVar20._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar16._24_4_;
      auVar20._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar16._28_4_;
      auVar20._32_4_ = (uint)(bVar6 & 1) * auVar16._32_4_;
      auVar20._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar16._36_4_;
      auVar20._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar16._40_4_;
      auVar20._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar16._44_4_;
      auVar20._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar16._48_4_;
      auVar20._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar16._52_4_;
      auVar20._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar16._56_4_;
      auVar20._60_4_ = (uint)(bVar6 >> 7) * auVar16._60_4_;
      auVar16 = vpmulld_avx512f(auVar20,auVar19);
      uVar10 = uVar10 + 0x10;
    } while ((uVar8 + 0xf & 0x1fffffff0) != uVar10);
    auVar15 = vmovdqa32_avx512f(auVar16);
    auVar16._0_4_ = (uint)(bVar5 & 1) * auVar15._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar19._0_4_;
    bVar3 = (bool)((byte)(uVar13 >> 1) & 1);
    auVar16._4_4_ = (uint)bVar3 * auVar15._4_4_ | (uint)!bVar3 * auVar19._4_4_;
    bVar3 = (bool)((byte)(uVar13 >> 2) & 1);
    auVar16._8_4_ = (uint)bVar3 * auVar15._8_4_ | (uint)!bVar3 * auVar19._8_4_;
    bVar3 = (bool)((byte)(uVar13 >> 3) & 1);
    auVar16._12_4_ = (uint)bVar3 * auVar15._12_4_ | (uint)!bVar3 * auVar19._12_4_;
    bVar3 = (bool)((byte)(uVar13 >> 4) & 1);
    auVar16._16_4_ = (uint)bVar3 * auVar15._16_4_ | (uint)!bVar3 * auVar19._16_4_;
    bVar3 = (bool)((byte)(uVar13 >> 5) & 1);
    auVar16._20_4_ = (uint)bVar3 * auVar15._20_4_ | (uint)!bVar3 * auVar19._20_4_;
    bVar3 = (bool)((byte)(uVar13 >> 6) & 1);
    auVar16._24_4_ = (uint)bVar3 * auVar15._24_4_ | (uint)!bVar3 * auVar19._24_4_;
    bVar3 = (bool)((byte)(uVar13 >> 7) & 1);
    auVar16._28_4_ = (uint)bVar3 * auVar15._28_4_ | (uint)!bVar3 * auVar19._28_4_;
    auVar16._32_4_ = (uint)(bVar6 & 1) * auVar15._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar19._32_4_;
    bVar3 = (bool)(bVar6 >> 1 & 1);
    auVar16._36_4_ = (uint)bVar3 * auVar15._36_4_ | (uint)!bVar3 * auVar19._36_4_;
    bVar3 = (bool)(bVar6 >> 2 & 1);
    auVar16._40_4_ = (uint)bVar3 * auVar15._40_4_ | (uint)!bVar3 * auVar19._40_4_;
    bVar3 = (bool)(bVar6 >> 3 & 1);
    auVar16._44_4_ = (uint)bVar3 * auVar15._44_4_ | (uint)!bVar3 * auVar19._44_4_;
    bVar3 = (bool)(bVar6 >> 4 & 1);
    auVar16._48_4_ = (uint)bVar3 * auVar15._48_4_ | (uint)!bVar3 * auVar19._48_4_;
    bVar3 = (bool)(bVar6 >> 5 & 1);
    auVar16._52_4_ = (uint)bVar3 * auVar15._52_4_ | (uint)!bVar3 * auVar19._52_4_;
    bVar3 = (bool)(bVar6 >> 6 & 1);
    auVar16._56_4_ = (uint)bVar3 * auVar15._56_4_ | (uint)!bVar3 * auVar19._56_4_;
    auVar16._60_4_ =
         (uint)(bVar6 >> 7) * auVar15._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar19._60_4_;
    auVar14 = vextracti64x4_avx512f(auVar16,1);
    auVar15 = vpmulld_avx512f(auVar16,ZEXT3264(auVar14));
    auVar25 = vpmulld_avx(auVar15._0_16_,auVar15._16_16_);
    auVar26 = vpshufd_avx(auVar25,0xee);
    auVar25 = vpmulld_avx(auVar25,auVar26);
    auVar26 = vpshufd_avx(auVar25,0x55);
    auVar25 = vpmulld_avx(auVar25,auVar26);
    iVar22 = auVar25._0_4_;
  }
  uVar8 = (ulong)(dEdxi->d).nd;
  if (uVar8 != 0) {
    auVar15 = vpbroadcastq_avx512f();
    auVar16 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar10 = 0;
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar19 = vmovdqa64_avx512f(auVar16);
      auVar16 = vpbroadcastq_avx512f();
      auVar20 = vporq_avx512f(auVar16,auVar17);
      auVar16 = vporq_avx512f(auVar16,auVar18);
      uVar4 = vpcmpuq_avx512f(auVar16,auVar15,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar20,auVar15,2);
      bVar6 = (byte)uVar4;
      uVar13 = CONCAT11(bVar6,bVar5);
      auVar16 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar10));
      auVar21._4_4_ = (uint)((byte)(uVar13 >> 1) & 1) * auVar16._4_4_;
      auVar21._0_4_ = (uint)(bVar5 & 1) * auVar16._0_4_;
      auVar21._8_4_ = (uint)((byte)(uVar13 >> 2) & 1) * auVar16._8_4_;
      auVar21._12_4_ = (uint)((byte)(uVar13 >> 3) & 1) * auVar16._12_4_;
      auVar21._16_4_ = (uint)((byte)(uVar13 >> 4) & 1) * auVar16._16_4_;
      auVar21._20_4_ = (uint)((byte)(uVar13 >> 5) & 1) * auVar16._20_4_;
      auVar21._24_4_ = (uint)((byte)(uVar13 >> 6) & 1) * auVar16._24_4_;
      auVar21._28_4_ = (uint)((byte)(uVar13 >> 7) & 1) * auVar16._28_4_;
      auVar21._32_4_ = (uint)(bVar6 & 1) * auVar16._32_4_;
      auVar21._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar16._36_4_;
      auVar21._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar16._40_4_;
      auVar21._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar16._44_4_;
      auVar21._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar16._48_4_;
      auVar21._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar16._52_4_;
      auVar21._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar16._56_4_;
      auVar21._60_4_ = (uint)(bVar6 >> 7) * auVar16._60_4_;
      auVar16 = vpmulld_avx512f(auVar21,auVar19);
      uVar10 = uVar10 + 0x10;
    } while ((uVar8 + 0xf & 0x1fffffff0) != uVar10);
    auVar15 = vmovdqa32_avx512f(auVar16);
    auVar17._0_4_ = (uint)(bVar5 & 1) * auVar15._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar19._0_4_;
    bVar3 = (bool)((byte)(uVar13 >> 1) & 1);
    auVar17._4_4_ = (uint)bVar3 * auVar15._4_4_ | (uint)!bVar3 * auVar19._4_4_;
    bVar3 = (bool)((byte)(uVar13 >> 2) & 1);
    auVar17._8_4_ = (uint)bVar3 * auVar15._8_4_ | (uint)!bVar3 * auVar19._8_4_;
    bVar3 = (bool)((byte)(uVar13 >> 3) & 1);
    auVar17._12_4_ = (uint)bVar3 * auVar15._12_4_ | (uint)!bVar3 * auVar19._12_4_;
    bVar3 = (bool)((byte)(uVar13 >> 4) & 1);
    auVar17._16_4_ = (uint)bVar3 * auVar15._16_4_ | (uint)!bVar3 * auVar19._16_4_;
    bVar3 = (bool)((byte)(uVar13 >> 5) & 1);
    auVar17._20_4_ = (uint)bVar3 * auVar15._20_4_ | (uint)!bVar3 * auVar19._20_4_;
    bVar3 = (bool)((byte)(uVar13 >> 6) & 1);
    auVar17._24_4_ = (uint)bVar3 * auVar15._24_4_ | (uint)!bVar3 * auVar19._24_4_;
    bVar3 = (bool)((byte)(uVar13 >> 7) & 1);
    auVar17._28_4_ = (uint)bVar3 * auVar15._28_4_ | (uint)!bVar3 * auVar19._28_4_;
    auVar17._32_4_ = (uint)(bVar6 & 1) * auVar15._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar19._32_4_;
    bVar3 = (bool)(bVar6 >> 1 & 1);
    auVar17._36_4_ = (uint)bVar3 * auVar15._36_4_ | (uint)!bVar3 * auVar19._36_4_;
    bVar3 = (bool)(bVar6 >> 2 & 1);
    auVar17._40_4_ = (uint)bVar3 * auVar15._40_4_ | (uint)!bVar3 * auVar19._40_4_;
    bVar3 = (bool)(bVar6 >> 3 & 1);
    auVar17._44_4_ = (uint)bVar3 * auVar15._44_4_ | (uint)!bVar3 * auVar19._44_4_;
    bVar3 = (bool)(bVar6 >> 4 & 1);
    auVar17._48_4_ = (uint)bVar3 * auVar15._48_4_ | (uint)!bVar3 * auVar19._48_4_;
    bVar3 = (bool)(bVar6 >> 5 & 1);
    auVar17._52_4_ = (uint)bVar3 * auVar15._52_4_ | (uint)!bVar3 * auVar19._52_4_;
    bVar3 = (bool)(bVar6 >> 6 & 1);
    auVar17._56_4_ = (uint)bVar3 * auVar15._56_4_ | (uint)!bVar3 * auVar19._56_4_;
    auVar17._60_4_ =
         (uint)(bVar6 >> 7) * auVar15._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar19._60_4_;
    auVar14 = vextracti64x4_avx512f(auVar17,1);
    auVar15 = vpmulld_avx512f(auVar17,ZEXT3264(auVar14));
    auVar25 = vpmulld_avx(auVar15._0_16_,auVar15._16_16_);
    auVar26 = vpshufd_avx(auVar25,0xee);
    auVar25 = vpmulld_avx(auVar25,auVar26);
    auVar26 = vpshufd_avx(auVar25,0x55);
    auVar25 = vpmulld_avx(auVar25,auVar26);
    iVar23 = auVar25._0_4_;
  }
  uVar7 = iVar23 * (dEdxi->d).bd;
  uVar8 = (ulong)uVar7;
  if (uVar7 != iVar22 * (dEdf->d).bd) {
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                 );
  }
  pfVar1 = dEdxi->v;
  uVar10 = uVar8;
  if ((((ulong)pfVar1 & 3) == 0) &&
     (uVar10 = (ulong)(-((uint)((ulong)pfVar1 >> 2) & 0x3fffffff) & 0xf), uVar8 <= uVar10)) {
    uVar10 = uVar8;
  }
  pfVar2 = dEdf->v;
  auVar25 = vcvtusi2ss_avx512f(in_XMM6,(long)(xs->
                                             super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(xs->
                                             super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start >> 3);
  uVar11 = uVar8 - uVar10;
  uVar9 = uVar11 + 0xf;
  if (-1 < (long)uVar11) {
    uVar9 = uVar11;
  }
  fVar24 = auVar25._0_4_;
  if (uVar10 != 0) {
    auVar25._0_4_ = 1.0 / fVar24;
    auVar25._4_12_ = SUB6012((undefined1  [60])0x0,0);
    uVar12 = 0;
    do {
      auVar26 = vfmadd213ss_fma(ZEXT416((uint)pfVar2[uVar12]),auVar25,ZEXT416((uint)pfVar1[uVar12]))
      ;
      pfVar1[uVar12] = auVar26._0_4_;
      uVar12 = uVar12 + 1;
    } while (uVar10 != uVar12);
  }
  uVar9 = (uVar9 & 0xfffffffffffffff0) + uVar10;
  if (0xf < (long)uVar11) {
    auVar26._0_4_ = 1.0 / fVar24;
    auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar15 = vbroadcastss_avx512f(auVar26);
    do {
      auVar16 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(pfVar2 + uVar10),auVar15,
                                    *(undefined1 (*) [64])(pfVar1 + uVar10));
      *(undefined1 (*) [64])(pfVar1 + uVar10) = auVar16;
      uVar10 = uVar10 + 0x10;
    } while ((long)uVar10 < (long)uVar9);
  }
  if ((long)uVar9 < (long)uVar8) {
    do {
      auVar25 = vfmadd213ss_fma(ZEXT416((uint)pfVar2[uVar9]),ZEXT416((uint)(1.0 / fVar24)),
                                ZEXT416((uint)pfVar1[uVar9]));
      pfVar1[uVar9] = auVar25._0_4_;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  return;
}

Assistant:

void Average::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
  dEdxi.vec() += (dEdf.vec() / xs.size());
}